

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_dr_mp3d_synth_pair(ma_dr_mp3d_sample_t *pcm,int nch,float *z)

{
  ma_int16 mVar1;
  
  mVar1 = ma_dr_mp3d_scale_pcm
                    (z[0x1c0] * 75038.0 +
                     (z[0x200] - z[0x180]) * 37489.0 +
                     (z[0x140] + z[0x240]) * 6574.0 +
                     (z[0x280] - z[0x100]) * 5153.0 +
                     (z[0xc0] + z[0x2c0]) * 2037.0 +
                     (z[0x300] - z[0x80]) * 459.0 +
                     (z[0x40] + z[0x340]) * 213.0 + (z[0x380] - *z) * 29.0);
  *pcm = mVar1;
  mVar1 = ma_dr_mp3d_scale_pcm
                    (z[2] * -5.0 +
                     z[0x82] * 146.0 +
                     z[0x102] * -45.0 +
                     z[0x182] * -9975.0 +
                     z[0x202] * 64019.0 + z[0x282] * 9727.0 + z[0x302] * 1567.0 + z[0x382] * 104.0);
  pcm[nch << 4] = mVar1;
  return;
}

Assistant:

static void ma_dr_mp3d_synth_pair(ma_dr_mp3d_sample_t *pcm, int nch, const float *z)
{
    float a;
    a  = (z[14*64] - z[    0]) * 29;
    a += (z[ 1*64] + z[13*64]) * 213;
    a += (z[12*64] - z[ 2*64]) * 459;
    a += (z[ 3*64] + z[11*64]) * 2037;
    a += (z[10*64] - z[ 4*64]) * 5153;
    a += (z[ 5*64] + z[ 9*64]) * 6574;
    a += (z[ 8*64] - z[ 6*64]) * 37489;
    a +=  z[ 7*64]             * 75038;
    pcm[0] = ma_dr_mp3d_scale_pcm(a);
    z += 2;
    a  = z[14*64] * 104;
    a += z[12*64] * 1567;
    a += z[10*64] * 9727;
    a += z[ 8*64] * 64019;
    a += z[ 6*64] * -9975;
    a += z[ 4*64] * -45;
    a += z[ 2*64] * 146;
    a += z[ 0*64] * -5;
    pcm[16*nch] = ma_dr_mp3d_scale_pcm(a);
}